

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O0

void __thiscall
OpenMD::SpatialStatistics::SpatialStatistics
          (SpatialStatistics *this,SimInfo *info,string *filename,string *sele,int nbins)

{
  undefined1 uVar1;
  string *in_RCX;
  undefined8 *in_RDI;
  SimInfo *in_stack_00000038;
  SelectionEvaluator *in_stack_00000040;
  SimInfo *in_stack_000001e8;
  SelectionManager *in_stack_000001f0;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  StaticAnalyser *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  StaticAnalyser *in_stack_ffffffffffffff50;
  SelectionManager *this_00;
  string local_90 [8];
  SelectionEvaluator *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff88;
  SelectionEvaluator *in_stack_ffffffffffffff90;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff50,
             (SimInfo *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (string *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  *in_RDI = &PTR__SpatialStatistics_005601e0;
  in_RDI[0x19] = 0;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),in_RCX);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000040,in_stack_00000038);
  this_00 = (SelectionManager *)(in_RDI + 0xc9);
  SelectionManager::SelectionManager(in_stack_000001f0,in_stack_000001e8);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_ffffffffffffff40 = (StaticAnalyser *)(in_RDI + 0xc9);
    SelectionEvaluator::evaluate(in_stack_ffffffffffffff78);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff48));
    SelectionSet::~SelectionSet((SelectionSet *)0x1b99e8);
  }
  getPrefix((string *)CONCAT17(uVar1,in_stack_ffffffffffffff48));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff48),(char *)in_stack_ffffffffffffff40);
  StaticAnalyser::setOutputName
            (in_stack_ffffffffffffff40,
             (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

SpatialStatistics::SpatialStatistics(SimInfo* info,
                                       const std::string& filename,
                                       const std::string& sele, int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    setOutputName(getPrefix(filename) + ".spst");
  }